

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.cpp
# Opt level: O1

M44d * Imath_3_2::procrustesRotationAndTranslation<double>
                 (M44d *__return_storage_ptr__,Vec3<double> *A,Vec3<double> *B,double *weights,
                 size_t numPoints,bool doScale)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  long lVar4;
  double *pdVar5;
  size_t sVar6;
  long lVar7;
  double *pdVar8;
  long lVar9;
  double (*A_00) [3];
  double dVar10;
  undefined1 auVar11 [16];
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  double dVar21;
  M33d C;
  M33d Qt;
  V3d S;
  M33d U;
  M33d V;
  double local_198;
  double dStack_190;
  double local_188;
  double dStack_180;
  double local_178;
  double dStack_170;
  double local_168;
  double dStack_160;
  double local_158;
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  double local_128;
  double dStack_120;
  double local_118;
  double local_110;
  double dStack_108;
  double local_100;
  double local_f8;
  double dStack_f0;
  double local_e8;
  Vec3<double> local_e0;
  Matrix33<double> local_c8;
  Matrix33<double> local_78;
  
  if (numPoints == 0) {
    __return_storage_ptr__->x[0][0] = 1.0;
    __return_storage_ptr__->x[0][1] = 0.0;
    __return_storage_ptr__->x[0][2] = 0.0;
    __return_storage_ptr__->x[0][3] = 0.0;
    __return_storage_ptr__->x[1][0] = 0.0;
    __return_storage_ptr__->x[1][1] = 1.0;
    __return_storage_ptr__->x[1][2] = 0.0;
    __return_storage_ptr__->x[1][3] = 0.0;
    __return_storage_ptr__->x[2][0] = 0.0;
    __return_storage_ptr__->x[2][1] = 0.0;
    __return_storage_ptr__->x[2][2] = 1.0;
    __return_storage_ptr__->x[2][3] = 0.0;
    __return_storage_ptr__->x[3][0] = 0.0;
    __return_storage_ptr__->x[3][1] = 0.0;
    __return_storage_ptr__->x[3][2] = 0.0;
    __return_storage_ptr__->x[3][3] = 1.0;
  }
  else {
    auVar19 = ZEXT816(0);
    if (weights == (double *)0x0) {
      lVar4 = 0x10;
      auVar20 = ZEXT816(0);
      auVar18 = ZEXT816(0);
      sVar6 = numPoints;
      do {
        pdVar5 = (double *)((long)A + lVar4 + -0x10);
        dVar10 = auVar20._8_8_;
        auVar20._0_8_ = auVar20._0_8_ + *pdVar5;
        auVar20._8_8_ = dVar10 + pdVar5[1];
        pdVar5 = (double *)((long)B + lVar4 + -0x10);
        dVar10 = auVar19._8_8_;
        auVar19._0_8_ = auVar19._0_8_ + *pdVar5;
        auVar19._8_8_ = dVar10 + pdVar5[1];
        dVar10 = auVar18._8_8_;
        auVar18._0_8_ = auVar18._0_8_ + *(double *)((long)&B->x + lVar4);
        auVar18._8_8_ = dVar10 + *(double *)((long)&A->x + lVar4);
        lVar4 = lVar4 + 0x18;
        sVar6 = sVar6 - 1;
      } while (sVar6 != 0);
      auVar11._8_4_ = (int)(numPoints >> 0x20);
      auVar11._0_8_ = numPoints;
      auVar11._12_4_ = 0x45300000;
      dVar10 = (auVar11._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)numPoints) - 4503599627370496.0);
    }
    else {
      dVar10 = 0.0;
      lVar4 = 2;
      sVar6 = 0;
      auVar20 = ZEXT816(0);
      auVar18 = ZEXT816(0);
      do {
        dVar21 = weights[sVar6];
        dVar10 = dVar10 + dVar21;
        pdVar5 = (double *)((long)A + lVar4 * 8 + -0x10);
        dVar15 = auVar20._8_8_;
        auVar20._0_8_ = auVar20._0_8_ + *pdVar5 * dVar21;
        auVar20._8_8_ = dVar15 + pdVar5[1] * dVar21;
        pdVar5 = (double *)((long)B + lVar4 * 8 + -0x10);
        dVar15 = auVar19._8_8_;
        auVar19._0_8_ = auVar19._0_8_ + *pdVar5 * dVar21;
        auVar19._8_8_ = dVar15 + pdVar5[1] * dVar21;
        dVar15 = auVar18._8_8_;
        auVar18._0_8_ = auVar18._0_8_ + (&B->x)[lVar4] * dVar21;
        auVar18._8_8_ = dVar15 + (&A->x)[lVar4] * dVar21;
        sVar6 = sVar6 + 1;
        lVar4 = lVar4 + 3;
      } while (numPoints != sVar6);
    }
    if ((dVar10 != 0.0) || (NAN(dVar10))) {
      lVar4 = numPoints + (numPoints == 0);
      auVar1._8_8_ = dVar10;
      auVar1._0_8_ = dVar10;
      local_148 = divpd(auVar20,auVar1);
      auVar2._8_8_ = dVar10;
      auVar2._0_8_ = dVar10;
      local_138 = divpd(auVar19,auVar2);
      auVar3._8_8_ = dVar10;
      auVar3._0_8_ = dVar10;
      auVar19 = divpd(auVar18,auVar3);
      local_198 = 0.0;
      dStack_190 = 0.0;
      local_188 = 0.0;
      dStack_180 = 0.0;
      local_178 = 0.0;
      dStack_170 = 0.0;
      local_168 = 0.0;
      dStack_160 = 0.0;
      local_158 = 0.0;
      dVar21 = auVar19._8_8_;
      dVar10 = auVar19._0_8_;
      if (weights == (double *)0x0) {
        lVar7 = 0x10;
        do {
          dVar13 = *(double *)((long)&B->x + lVar7) - dVar10;
          dVar14 = *(double *)((long)&A->x + lVar7) - dVar21;
          pdVar5 = (double *)((long)A + lVar7 + -0x10);
          dVar15 = *pdVar5 - local_148._0_8_;
          dVar12 = pdVar5[1] - local_148._8_8_;
          pdVar5 = (double *)((long)B + lVar7 + -0x10);
          dVar16 = *pdVar5 - local_138._0_8_;
          dVar17 = pdVar5[1] - local_138._8_8_;
          local_198 = local_198 + dVar16 * dVar15;
          dStack_190 = dStack_190 + dVar16 * dVar12;
          local_188 = local_188 + dVar14 * dVar16;
          dStack_180 = dStack_180 + dVar15 * dVar17;
          local_178 = local_178 + dVar12 * dVar17;
          dStack_170 = dStack_170 + dVar14 * dVar17;
          local_168 = local_168 + dVar13 * dVar15;
          dStack_160 = dStack_160 + dVar13 * dVar12;
          local_158 = local_158 + dVar14 * dVar13;
          lVar7 = lVar7 + 0x18;
          lVar4 = lVar4 + -1;
        } while (lVar4 != 0);
      }
      else {
        lVar7 = 2;
        lVar9 = 0;
        do {
          dVar15 = weights[lVar9];
          dVar12 = ((&B->x)[lVar7] - dVar10) * dVar15;
          dVar13 = (&A->x)[lVar7] - dVar21;
          pdVar5 = (double *)((long)A + lVar7 * 8 + -0x10);
          dVar16 = *pdVar5 - local_148._0_8_;
          dVar17 = pdVar5[1] - local_148._8_8_;
          pdVar5 = (double *)((long)B + lVar7 * 8 + -0x10);
          dVar14 = dVar15 * (*pdVar5 - local_138._0_8_);
          dVar15 = dVar15 * (pdVar5[1] - local_138._8_8_);
          local_198 = local_198 + dVar14 * dVar16;
          dStack_190 = dStack_190 + dVar14 * dVar17;
          local_188 = local_188 + dVar13 * dVar14;
          dStack_180 = dStack_180 + dVar16 * dVar15;
          local_178 = local_178 + dVar17 * dVar15;
          dStack_170 = dStack_170 + dVar13 * dVar15;
          local_168 = local_168 + dVar12 * dVar16;
          dStack_160 = dStack_160 + dVar12 * dVar17;
          local_158 = local_158 + dVar13 * dVar12;
          lVar9 = lVar9 + 1;
          lVar7 = lVar7 + 3;
        } while (lVar4 != lVar9);
      }
      A_00 = (double (*) [3])&local_198;
      local_c8.x[0][0] = 1.0;
      local_c8.x[0][1] = 0.0;
      local_c8.x[0][2] = 0.0;
      local_c8.x[1][0] = 0.0;
      local_c8.x[1][1] = 1.0;
      local_c8.x[1][2] = 0.0;
      local_c8.x[2][0] = 0.0;
      local_c8.x[2][1] = 0.0;
      local_c8.x[2][2] = 1.0;
      local_78.x[0][0] = 1.0;
      local_78.x[0][1] = 0.0;
      local_78.x[0][2] = 0.0;
      local_78.x[1][0] = 0.0;
      local_78.x[1][1] = 1.0;
      local_78.x[1][2] = 0.0;
      local_78.x[2][0] = 0.0;
      local_78.x[2][1] = 0.0;
      local_78.x[2][2] = 1.0;
      jacobiSVD<double>((Matrix33<double> *)A_00,&local_c8,&local_e0,&local_78,2.220446049250313e-16
                        ,true);
      local_128 = local_78.x[0][2] * local_c8.x[0][2] +
                  local_78.x[0][0] * local_c8.x[0][0] + local_78.x[0][1] * local_c8.x[0][1];
      dStack_120 = local_78.x[0][2] * local_c8.x[1][2] +
                   local_78.x[0][0] * local_c8.x[1][0] + local_78.x[0][1] * local_c8.x[1][1];
      local_118 = local_78.x[0][2] * local_c8.x[2][2] +
                  local_78.x[0][0] * local_c8.x[2][0] + local_c8.x[2][1] * local_78.x[0][1];
      local_110 = local_78.x[1][2] * local_c8.x[0][2] +
                  local_78.x[1][0] * local_c8.x[0][0] + local_78.x[1][1] * local_c8.x[0][1];
      dStack_108 = local_78.x[1][2] * local_c8.x[1][2] +
                   local_78.x[1][0] * local_c8.x[1][0] + local_78.x[1][1] * local_c8.x[1][1];
      local_100 = local_78.x[1][2] * local_c8.x[2][2] +
                  local_78.x[1][0] * local_c8.x[2][0] + local_c8.x[2][1] * local_78.x[1][1];
      local_f8 = local_78.x[2][2] * local_c8.x[0][2] +
                 local_78.x[2][0] * local_c8.x[0][0] + local_78.x[2][1] * local_c8.x[0][1];
      dStack_f0 = local_78.x[2][2] * local_c8.x[1][2] +
                  local_78.x[2][0] * local_c8.x[1][0] + local_78.x[2][1] * local_c8.x[1][1];
      local_e8 = local_78.x[2][2] * local_c8.x[2][2] +
                 local_78.x[2][0] * local_c8.x[2][0] + local_c8.x[2][1] * local_78.x[2][1];
      if (doScale && numPoints != 1) {
        lVar4 = numPoints + (numPoints == 0);
        if (weights == (double *)0x0) {
          pdVar5 = &A->z;
          dVar12 = 0.0;
          dVar15 = 0.0;
          do {
            dVar13 = ((Vec3<double> *)(pdVar5 + -2))->x - (double)local_148._0_8_;
            dVar12 = ((*pdVar5 - dVar21) * (*pdVar5 - dVar21) +
                     dVar13 * dVar13 +
                     (pdVar5[-1] - (double)local_148._8_8_) * (pdVar5[-1] - (double)local_148._8_8_)
                     ) - dVar12;
            dVar13 = dVar15 + dVar12;
            dVar12 = (dVar13 - dVar15) - dVar12;
            pdVar5 = pdVar5 + 3;
            lVar4 = lVar4 + -1;
            dVar15 = dVar13;
          } while (lVar4 != 0);
        }
        else {
          pdVar5 = &A->z;
          lVar7 = 0;
          dVar12 = 0.0;
          dVar15 = 0.0;
          do {
            dVar13 = ((Vec3<double> *)(pdVar5 + -2))->x - (double)local_148._0_8_;
            dVar12 = ((*pdVar5 - dVar21) * (*pdVar5 - dVar21) +
                     dVar13 * dVar13 +
                     (pdVar5[-1] - (double)local_148._8_8_) * (pdVar5[-1] - (double)local_148._8_8_)
                     ) * weights[lVar7] - dVar12;
            dVar13 = dVar15 + dVar12;
            dVar12 = (dVar13 - dVar15) - dVar12;
            lVar7 = lVar7 + 1;
            pdVar5 = pdVar5 + 3;
            dVar15 = dVar13;
          } while (lVar4 != lVar7);
        }
        dVar15 = 0.0;
        pdVar5 = &local_128;
        lVar4 = 0;
        dVar12 = 0.0;
        do {
          lVar7 = 0;
          pdVar8 = pdVar5;
          dVar14 = dVar15;
          do {
            dVar12 = *pdVar8 * (*(double (*) [3])*A_00)[lVar7] - dVar12;
            dVar15 = dVar14 + dVar12;
            dVar12 = (dVar15 - dVar14) - dVar12;
            lVar7 = lVar7 + 1;
            pdVar8 = pdVar8 + 3;
            dVar14 = dVar15;
          } while (lVar7 != 3);
          lVar4 = lVar4 + 1;
          A_00 = A_00 + 1;
          pdVar5 = pdVar5 + 1;
        } while (lVar4 != 3);
        dVar15 = dVar15 / dVar13;
      }
      else {
        dVar15 = 1.0;
      }
      dVar13 = (double)local_148._0_8_ * dVar15;
      dVar12 = (double)local_148._8_8_ * dVar15;
      dVar21 = dVar21 * dVar15;
      __return_storage_ptr__->x[0][0] = local_128 * dVar15;
      __return_storage_ptr__->x[0][1] = dStack_120 * dVar15;
      __return_storage_ptr__->x[0][2] = local_118 * dVar15;
      __return_storage_ptr__->x[0][3] = 0.0;
      __return_storage_ptr__->x[1][0] = local_110 * dVar15;
      __return_storage_ptr__->x[1][1] = dStack_108 * dVar15;
      __return_storage_ptr__->x[1][2] = local_100 * dVar15;
      __return_storage_ptr__->x[1][3] = 0.0;
      __return_storage_ptr__->x[2][0] = dVar15 * local_f8;
      __return_storage_ptr__->x[2][1] = dVar15 * dStack_f0;
      __return_storage_ptr__->x[2][2] = local_e8 * dVar15;
      __return_storage_ptr__->x[2][3] = 0.0;
      __return_storage_ptr__->x[3][0] =
           (double)local_138._0_8_ - (dVar21 * local_f8 + dVar13 * local_128 + dVar12 * local_110);
      __return_storage_ptr__->x[3][1] =
           (double)local_138._8_8_ -
           (dVar21 * dStack_f0 + dVar13 * dStack_120 + dVar12 * dStack_108);
      __return_storage_ptr__->x[3][2] =
           dVar10 - (dVar21 * local_e8 + dVar13 * local_118 + local_100 * dVar12);
    }
    else {
      __return_storage_ptr__->x[0][0] = 1.0;
      __return_storage_ptr__->x[0][1] = 0.0;
      __return_storage_ptr__->x[0][2] = 0.0;
      __return_storage_ptr__->x[0][3] = 0.0;
      __return_storage_ptr__->x[1][0] = 0.0;
      __return_storage_ptr__->x[1][1] = 1.0;
      __return_storage_ptr__->x[1][2] = 0.0;
      __return_storage_ptr__->x[1][3] = 0.0;
      __return_storage_ptr__->x[2][0] = 0.0;
      __return_storage_ptr__->x[2][1] = 0.0;
      __return_storage_ptr__->x[2][2] = 1.0;
      __return_storage_ptr__->x[2][3] = 0.0;
      __return_storage_ptr__->x[3][0] = 0.0;
      __return_storage_ptr__->x[3][1] = 0.0;
      __return_storage_ptr__->x[3][2] = 0.0;
    }
    __return_storage_ptr__->x[3][3] = 1.0;
  }
  return __return_storage_ptr__;
}

Assistant:

M44d
procrustesRotationAndTranslation (
    const Vec3<T>* A,
    const Vec3<T>* B,
    const T*       weights,
    const size_t   numPoints,
    const bool     doScale)
{
    if (numPoints == 0) return M44d ();

    // Always do the accumulation in double precision:
    V3d    Acenter (0.0);
    V3d    Bcenter (0.0);
    double weightsSum = 0.0;

    if (weights == 0)
    {
        for (size_t i = 0; i < numPoints; ++i)
        {
            Acenter += (V3d) A[i];
            Bcenter += (V3d) B[i];
        }
        weightsSum = (double) numPoints;
    }
    else
    {
        for (size_t i = 0; i < numPoints; ++i)
        {
            const double w = weights[i];
            weightsSum += w;

            Acenter += w * (V3d) A[i];
            Bcenter += w * (V3d) B[i];
        }
    }

    if (weightsSum == 0) return M44d ();

    Acenter /= weightsSum;
    Bcenter /= weightsSum;

    //
    // Find Q such that |Q*A - B|  (actually A-Acenter and B-Bcenter, weighted)
    // is minimized in the least squares sense.
    // From Golub/Van Loan, p.601
    //
    // A,B are 3xn
    // Let C = B A^T   (where A is 3xn and B^T is nx3, so C is 3x3)
    // Compute the SVD: C = U D V^T  (U,V rotations, D diagonal).
    // Throw away the D part, and return Q = U V^T
    M33d C (0.0);
    if (weights == 0)
    {
        for (size_t i = 0; i < numPoints; ++i)
            C += outerProduct ((V3d) B[i] - Bcenter, (V3d) A[i] - Acenter);
    }
    else
    {
        for (size_t i = 0; i < numPoints; ++i)
        {
            const double w = weights[i];
            C +=
                outerProduct (w * ((V3d) B[i] - Bcenter), (V3d) A[i] - Acenter);
        }
    }

    M33d U, V;
    V3d  S;
    jacobiSVD (C, U, S, V, std::numeric_limits<double>::epsilon (), true);

    // We want Q.transposed() here since we are going to be using it in the
    // Imath style (multiplying vectors on the right, v' = v*A^T):
    const M33d Qt = V * U.transposed ();

    double s = 1.0;
    if (doScale && numPoints > 1)
    {
        // Finding a uniform scale: let us assume the Q is completely fixed
        // at this point (solving for both simultaneously seems much harder).
        // We are trying to compute (again, per Golub and van Loan)
        //    min || s*A*Q - B ||_F
        // Notice that we've jammed a uniform scale in front of the Q.
        // Now, the Frobenius norm (the least squares norm over matrices)
        // has the neat property that it is equivalent to minimizing the trace
        // of M^T*M (see your friendly neighborhood linear algebra text for a
        // derivation).  Thus, we can expand this out as
        //   min tr (s*A*Q - B)^T*(s*A*Q - B)
        // = min tr(Q^T*A^T*s*s*A*Q) + tr(B^T*B) - 2*tr(Q^T*A^T*s*B)  by linearity of the trace
        // = min s^2 tr(A^T*A) + tr(B^T*B) - 2*s*tr(Q^T*A^T*B)        using the fact that the trace is invariant
        //                                                            under similarity transforms Q*M*Q^T
        // If we differentiate w.r.t. s and set this to 0, we get
        // 0 = 2*s*tr(A^T*A) - 2*tr(Q^T*A^T*B)
        // so
        // 2*s*tr(A^T*A) = 2*s*tr(Q^T*A^T*B)
        // s = tr(Q^T*A^T*B) / tr(A^T*A)

        KahanSum traceATA;
        if (weights == 0)
        {
            for (size_t i = 0; i < numPoints; ++i)
                traceATA += ((V3d) A[i] - Acenter).length2 ();
        }
        else
        {
            for (size_t i = 0; i < numPoints; ++i)
                traceATA +=
                    ((double) weights[i]) * ((V3d) A[i] - Acenter).length2 ();
        }

        KahanSum traceBATQ;
        for (int i = 0; i < 3; ++i)
            for (int j = 0; j < 3; ++j)
                traceBATQ += Qt[j][i] * C[i][j];

        s = traceBATQ.get () / traceATA.get ();
    }

    // Q is the rotation part of what we want to return.
    // The entire transform is:
    //    (translate origin to Bcenter) * Q * (translate Acenter to origin)
    //                last                                first
    // The effect of this on a point is:
    //    (translate origin to Bcenter) * Q * (translate Acenter to origin) * point
    //  = (translate origin to Bcenter) * Q * (-Acenter + point)
    //  = (translate origin to Bcenter) * (-Q*Acenter + Q*point)
    //  = (translate origin to Bcenter) * (translate Q*Acenter to origin) * Q*point
    //  = (translate Q*Acenter to Bcenter) * Q*point
    // So what we want to return is:
    //    (translate Q*Acenter to Bcenter) * Q
    //
    // In block form, this is:
    //   [ 1 0 0  | ] [       0 ] [ 1 0 0  |  ]   [ 1 0 0  | ] [           |   ]   [                 ]
    //   [ 0 1 0 tb ] [  s*Q  0 ] [ 0 1 0 -ta ] = [ 0 1 0 tb ] [  s*Q  -s*Q*ta ] = [   Q   tb-s*Q*ta ]
    //   [ 0 0 1  | ] [       0 ] [ 0 0 1  |  ]   [ 0 0 1  | ] [           |   ]   [                 ]
    //   [ 0 0 0  1 ] [ 0 0 0 1 ] [ 0 0 0  1  ]   [ 0 0 0  1 ] [ 0 0 0     1   ]   [ 0 0 0    1      ]
    // (ofc the whole thing is transposed for Imath).
    const V3d translate = Bcenter - s * Acenter * Qt;

    return M44d (
        s * Qt.x[0][0],
        s * Qt.x[0][1],
        s * Qt.x[0][2],
        T (0),
        s * Qt.x[1][0],
        s * Qt.x[1][1],
        s * Qt.x[1][2],
        T (0),
        s * Qt.x[2][0],
        s * Qt.x[2][1],
        s * Qt.x[2][2],
        T (0),
        translate.x,
        translate.y,
        translate.z,
        T (1));
}